

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ay8910.c
# Opt level: O2

UINT32 ay8910_get_sample_rate(void *chip)

{
  uint uVar1;
  
  uVar1 = *(uint *)((long)chip + 0x2c8);
  if (*(int *)((long)chip + 8) == 1) {
    uVar1 = uVar1 >> (*(byte *)((long)chip + 0x2cd) >> 4 & 1);
  }
  return uVar1 >> 3;
}

Assistant:

UINT32 ay8910_get_sample_rate(void *chip)
{
	ay8910_context *psg = (ay8910_context *)chip;
	UINT32 master_clock = psg->clock;
	
	if (psg->type == PSG_TYPE_YM)
	{
		// YM2149 master clock divider
		if (psg->chip_flags & YM2149_PIN26_LOW)
			master_clock /= 2;
	}
	/* The envelope is pacing twice as fast for the YM2149 as for the AY-3-8910,    */
	/* This handled by the step parameter. Consequently we use a divider of 8 here. */
	return master_clock / 8;
}